

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::Grammar::Create
          (Grammar *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *symbolMap,
          vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          *prodList)

{
  size_type sVar1;
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  *prodList_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *symbolMap_local;
  Grammar *this_local;
  
  if (this->ProductionCount == 0) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->StartSymbols);
    if (sVar1 == 0) goto LAB_00141a75;
  }
  Clear(this);
LAB_00141a75:
  AddGrammarSymbols(this,symbolMap);
  AddProductions(this,prodList);
  return;
}

Assistant:

void Grammar::Create(const std::map<String, unsigned>& symbolMap,
                     std::vector<Production>& prodList) {
    // Clears the grammar if it is already valid
    if (ProductionCount || StartSymbols.size())
        Clear();
    // Adds the grammar data
    AddGrammarSymbols(symbolMap);
    AddProductions(prodList);
}